

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

Entity * __thiscall Entity::getPlayerCollision(Entity *this)

{
  ResourceManager *this_00;
  Entity *pEVar1;
  list<Entity_*,_std::allocator<Entity_*>_> e;
  value_type local_18;
  
  e.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&e;
  e.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node._M_size = 0;
  e.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.super__List_node_base.
  _M_prev = e.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  this_00 = ResourceManager::getInstance();
  local_18 = (value_type)ResourceManager::getData(this_00,1);
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back(&e,&local_18);
  pEVar1 = checkCollisions(this,&e);
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::clear
            ((list<Entity_*,_std::allocator<Entity_*>_> *)
             &e.super__List_base<Entity_*,_std::allocator<Entity_*>_>);
  std::__cxx11::_List_base<Entity_*,_std::allocator<Entity_*>_>::_M_clear
            (&e.super__List_base<Entity_*,_std::allocator<Entity_*>_>);
  return pEVar1;
}

Assistant:

Entity *Entity::getPlayerCollision(void)
{
   std::list<Entity *> e;

   ResourceManager& rm = ResourceManager::getInstance();
   Player *player = (Player *)rm.getData(RES_PLAYER);

   e.push_back(player);

   Entity *ret = checkCollisions(e);
   e.clear();
   return ret;
}